

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int32_t zng_deflateInit2(zng_stream *strm,int32_t level,int32_t method,int32_t windowBits,
                        int32_t memLevel,int32_t strategy)

{
  deflate_state *pdVar1;
  uchar *puVar2;
  Pos *pPVar3;
  Pos *pPVar4;
  uchar *puVar5;
  int32_t iVar6;
  deflate_allocs *pdVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint lit_bufsize;
  uint uVar11;
  
  (*functable.force_init)();
  iVar6 = -2;
  if (strm == (zng_stream *)0x0) {
    return -2;
  }
  strm->msg = (char *)0x0;
  if (strm->zalloc == (alloc_func)0x0) {
    strm->zalloc = zng_zcalloc;
    strm->opaque = (void *)0x0;
  }
  if (strm->zfree == (free_func)0x0) {
    strm->zfree = zng_zcfree;
  }
  uVar11 = 6;
  if (level != -1) {
    uVar11 = level;
  }
  if (windowBits < 0) {
    if (windowBits < -0xf) {
      return -2;
    }
    windowBits = -windowBits;
    iVar9 = 0;
  }
  else {
    if (windowBits < 0x10) {
      iVar9 = 1;
      bVar8 = 0;
      goto LAB_00130af9;
    }
    windowBits = windowBits - 0x10;
    iVar9 = 2;
  }
  bVar8 = 1;
LAB_00130af9:
  if (((((uint)strategy < 5) && (uVar11 < 10)) && (method == 8)) &&
     (((0xfffffff6 < memLevel - 10U && (0xfffffff7 < windowBits - 0x10U)) &&
      (!(bool)(windowBits == 8U & bVar8))))) {
    uVar10 = 9;
    if (windowBits != 8) {
      uVar10 = windowBits;
    }
    bVar8 = (byte)memLevel;
    lit_bufsize = 0x40 << (bVar8 & 0x1f);
    pdVar7 = alloc_deflate(strm,uVar10,lit_bufsize);
    iVar6 = -4;
    if (pdVar7 != (deflate_allocs *)0x0) {
      pdVar1 = pdVar7->state;
      pdVar1->alloc_bufs = pdVar7;
      puVar2 = pdVar7->window;
      pdVar1->window = puVar2;
      pPVar3 = pdVar7->prev;
      pdVar1->prev = pPVar3;
      pPVar4 = pdVar7->head;
      pdVar1->head = pPVar4;
      puVar5 = pdVar7->pending_buf;
      pdVar1->pending_buf = puVar5;
      strm->state = pdVar1;
      pdVar1->strm = strm;
      pdVar1->status = 1;
      pdVar1->wrap = iVar9;
      pdVar1->gzhead = (zng_gz_headerp)0x0;
      pdVar1->w_bits = uVar10;
      uVar10 = 1 << ((byte)uVar10 & 0x1f);
      pdVar1->w_size = uVar10;
      pdVar1->w_mask = uVar10 - 1;
      pdVar1->high_water = 0;
      pdVar1->lit_bufsize = lit_bufsize;
      pdVar1->pending_buf_size = 0x100 << (bVar8 & 0x1f);
      if ((puVar5 != (uchar *)0x0 && pPVar4 != (Pos *)0x0) &&
          (pPVar3 != (Pos *)0x0 && puVar2 != (uchar *)0x0)) {
        pdVar1->d_buf = (uint16_t *)(puVar5 + (uint)(0x80 << (bVar8 & 0x1f)));
        pdVar1->l_buf = puVar5 + (uint)(0x100 << (bVar8 & 0x1f));
        pdVar1->sym_end = lit_bufsize - 1;
        pdVar1->level = uVar11;
        pdVar1->strategy = strategy;
        pdVar1->reproducible = 0;
        pdVar1->block_open = 0;
        iVar6 = zng_deflateReset(strm);
        return iVar6;
      }
      pdVar1->status = 3;
      strm->msg = "insufficient memory";
      zng_deflateEnd(strm);
    }
  }
  return iVar6;
}

Assistant:

PREFIX(deflateInit2)(PREFIX3(stream) *strm, int32_t level, int32_t method, int32_t windowBits,
                                            int32_t memLevel, int32_t strategy) {
    /* Todo: ignore strm->next_in if we use it as window */
    deflate_state *s;
    int wrap = 1;

    /* Initialize functable */
    FUNCTABLE_INIT;

    if (strm == NULL)
        return Z_STREAM_ERROR;

    strm->msg = NULL;
    if (strm->zalloc == NULL) {
        strm->zalloc = PREFIX(zcalloc);
        strm->opaque = NULL;
    }
    if (strm->zfree == NULL)
        strm->zfree = PREFIX(zcfree);

    if (level == Z_DEFAULT_COMPRESSION)
        level = 6;

    if (windowBits < 0) { /* suppress zlib wrapper */
        wrap = 0;
        if (windowBits < -MAX_WBITS)
            return Z_STREAM_ERROR;
        windowBits = -windowBits;
#ifdef GZIP
    } else if (windowBits > MAX_WBITS) {
        wrap = 2;       /* write gzip wrapper instead */
        windowBits -= 16;
#endif
    }
    if (memLevel < 1 || memLevel > MAX_MEM_LEVEL || method != Z_DEFLATED || windowBits < MIN_WBITS ||
        windowBits > MAX_WBITS || level < 0 || level > 9 || strategy < 0 || strategy > Z_FIXED ||
        (windowBits == 8 && wrap != 1)) {
        return Z_STREAM_ERROR;
    }
    if (windowBits == 8)
        windowBits = 9;  /* until 256-byte window bug fixed */

    /* Allocate buffers */
    int lit_bufsize = 1 << (memLevel + 6);
    deflate_allocs *alloc_bufs = alloc_deflate(strm, windowBits, lit_bufsize);
    if (alloc_bufs == NULL)
        return Z_MEM_ERROR;

    s = alloc_bufs->state;
    s->alloc_bufs = alloc_bufs;
    s->window = alloc_bufs->window;
    s->prev = alloc_bufs->prev;
    s->head = alloc_bufs->head;
    s->pending_buf = alloc_bufs->pending_buf;

    strm->state = (struct internal_state *)s;
    s->strm = strm;
    s->status = INIT_STATE;     /* to pass state test in deflateReset() */

    s->wrap = wrap;
    s->gzhead = NULL;
    s->w_bits = (unsigned int)windowBits;
    s->w_size = 1 << s->w_bits;
    s->w_mask = s->w_size - 1;

    s->high_water = 0;      /* nothing written to s->window yet */

    s->lit_bufsize = lit_bufsize; /* 16K elements by default */

    /* We overlay pending_buf and sym_buf. This works since the average size
     * for length/distance pairs over any compressed block is assured to be 31
     * bits or less.
     *
     * Analysis: The longest fixed codes are a length code of 8 bits plus 5
     * extra bits, for lengths 131 to 257. The longest fixed distance codes are
     * 5 bits plus 13 extra bits, for distances 16385 to 32768. The longest
     * possible fixed-codes length/distance pair is then 31 bits total.
     *
     * sym_buf starts one-fourth of the way into pending_buf. So there are
     * three bytes in sym_buf for every four bytes in pending_buf. Each symbol
     * in sym_buf is three bytes -- two for the distance and one for the
     * literal/length. As each symbol is consumed, the pointer to the next
     * sym_buf value to read moves forward three bytes. From that symbol, up to
     * 31 bits are written to pending_buf. The closest the written pending_buf
     * bits gets to the next sym_buf symbol to read is just before the last
     * code is written. At that time, 31*(n-2) bits have been written, just
     * after 24*(n-2) bits have been consumed from sym_buf. sym_buf starts at
     * 8*n bits into pending_buf. (Note that the symbol buffer fills when n-1
     * symbols are written.) The closest the writing gets to what is unread is
     * then n+14 bits. Here n is lit_bufsize, which is 16384 by default, and
     * can range from 128 to 32768.
     *
     * Therefore, at a minimum, there are 142 bits of space between what is
     * written and what is read in the overlain buffers, so the symbols cannot
     * be overwritten by the compressed data. That space is actually 139 bits,
     * due to the three-bit fixed-code block header.
     *
     * That covers the case where either Z_FIXED is specified, forcing fixed
     * codes, or when the use of fixed codes is chosen, because that choice
     * results in a smaller compressed block than dynamic codes. That latter
     * condition then assures that the above analysis also covers all dynamic
     * blocks. A dynamic-code block will only be chosen to be emitted if it has
     * fewer bits than a fixed-code block would for the same set of symbols.
     * Therefore its average symbol length is assured to be less than 31. So
     * the compressed data for a dynamic block also cannot overwrite the
     * symbols from which it is being constructed.
     */

    s->pending_buf_size = s->lit_bufsize * 4;

    if (s->window == NULL || s->prev == NULL || s->head == NULL || s->pending_buf == NULL) {
        s->status = FINISH_STATE;
        strm->msg = ERR_MSG(Z_MEM_ERROR);
        PREFIX(deflateEnd)(strm);
        return Z_MEM_ERROR;
    }

#ifdef LIT_MEM
    s->d_buf = (uint16_t *)(s->pending_buf + (s->lit_bufsize << 1));
    s->l_buf = s->pending_buf + (s->lit_bufsize << 2);
    s->sym_end = s->lit_bufsize - 1;
#else
    s->sym_buf = s->pending_buf + s->lit_bufsize;
    s->sym_end = (s->lit_bufsize - 1) * 3;
#endif
    /* We avoid equality with lit_bufsize*3 because of wraparound at 64K
     * on 16 bit machines and because stored blocks are restricted to
     * 64K-1 bytes.
     */

    s->level = level;
    s->strategy = strategy;
    s->block_open = 0;
    s->reproducible = 0;

    return PREFIX(deflateReset)(strm);
}